

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O2

fio_str_info_s * fiobj_obj2cstr(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  uint uVar1;
  fiobj_object_vtable_s *pfVar2;
  undefined4 uVar3;
  
  if (o != 0) {
    if ((o & 1) != 0) {
      fio_ltocstr(__return_storage_ptr__,(long)o >> 1);
      return __return_storage_ptr__;
    }
    if ((~(uint)o & 6) != 0) {
LAB_001518fb:
      pfVar2 = fiobj_type_vtable(o);
      (*pfVar2->to_str)(__return_storage_ptr__,o);
      return __return_storage_ptr__;
    }
    if ((char)o == '&') {
      __return_storage_ptr__->data = "false";
      uVar3 = 5;
      goto LAB_001518e6;
    }
    uVar1 = (uint)o & 0xff;
    if (uVar1 == 0x16) {
      __return_storage_ptr__->data = "true";
      uVar3 = 4;
      goto LAB_001518e6;
    }
    if (uVar1 != 6) goto LAB_001518fb;
  }
  __return_storage_ptr__->data = "null";
  uVar3 = 4;
LAB_001518e6:
  *(undefined4 *)&__return_storage_ptr__->capa = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->capa + 4) = 0;
  *(undefined4 *)&__return_storage_ptr__->len = uVar3;
  *(undefined4 *)((long)&__return_storage_ptr__->len + 4) = 0;
  return __return_storage_ptr__;
}

Assistant:

FIO_INLINE fio_str_info_s fiobj_obj2cstr(const FIOBJ o) {
  if (!o) {
    fio_str_info_s ret = {0, 4, (char *)"null"};
    return ret;
  }
  if (o & FIOBJECT_NUMBER_FLAG)
    return fio_ltocstr(((intptr_t)o) >> 1);
  if ((o & FIOBJECT_PRIMITIVE_FLAG) == FIOBJECT_PRIMITIVE_FLAG) {
    switch ((fiobj_type_enum)o) {
    case FIOBJ_T_NULL: {
      fio_str_info_s ret = {0, 4, (char *)"null"};
      return ret;
    }
    case FIOBJ_T_FALSE: {
      fio_str_info_s ret = {0, 5, (char *)"false"};
      return ret;
    }
    case FIOBJ_T_TRUE: {
      fio_str_info_s ret = {0, 4, (char *)"true"};
      return ret;
    }
    default:
      break;
    }
  }
  return FIOBJECT2VTBL(o)->to_str(o);
}